

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::ubjson::
basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::begin_object(basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
               *this,json_visitor *visitor,error_code *ec)

{
  size_t *psVar1;
  int iVar2;
  uchar *puVar3;
  uchar *puVar4;
  byte bVar5;
  uchar *puVar6;
  size_t sVar7;
  ubjson_errc __e;
  ulong uVar8;
  ulong uVar9;
  uint8_t b;
  size_t length;
  uchar local_2d;
  parse_mode local_2c;
  size_t local_28;
  
  iVar2 = this->nesting_depth_;
  this->nesting_depth_ = iVar2 + 1;
  if (iVar2 < *(int *)((this->options_)._vptr_ubjson_decode_options[-3] + 8 +
                      (long)&(this->options_)._vptr_ubjson_decode_options)) {
    puVar3 = (this->source_).current_._M_current;
    puVar4 = (this->source_).end_._M_current;
    if (puVar3 == puVar4) {
      __e = unexpected_eof;
    }
    else if (*puVar3 == '#') {
      psVar1 = &(this->source_).position_;
      *psVar1 = *psVar1 + 1;
      (this->source_).current_._M_current = puVar3 + 1;
      local_28 = get_length(this,ec);
      if (ec->_M_value != 0) {
        return;
      }
      if (local_28 <= (this->options_).max_items_) {
        local_2c = map_key;
        std::vector<jsoncons::ubjson::parse_state,std::allocator<jsoncons::ubjson::parse_state>>::
        emplace_back<jsoncons::ubjson::parse_mode,unsigned_long&>
                  ((vector<jsoncons::ubjson::parse_state,std::allocator<jsoncons::ubjson::parse_state>>
                    *)&this->state_stack_,&local_2c,&local_28);
        (*visitor->_vptr_basic_json_visitor[4])(visitor,local_28,0,this,ec);
        goto LAB_007a24e3;
      }
      __e = max_items_exceeded;
    }
    else {
      if (*puVar3 != '$') {
        local_28 = CONCAT44(local_28._4_4_,9);
        local_2c = root;
        std::vector<jsoncons::ubjson::parse_state,std::allocator<jsoncons::ubjson::parse_state>>::
        emplace_back<jsoncons::ubjson::parse_mode,int>
                  ((vector<jsoncons::ubjson::parse_state,std::allocator<jsoncons::ubjson::parse_state>>
                    *)&this->state_stack_,(parse_mode *)&local_28,(int *)&local_2c);
        (*visitor->_vptr_basic_json_visitor[3])(visitor,0,this,ec);
LAB_007a24e3:
        this->more_ = (bool)(this->cursor_mode_ ^ 1);
        return;
      }
      sVar7 = (this->source_).position_ + 1;
      (this->source_).position_ = sVar7;
      puVar6 = puVar3 + 1;
      (this->source_).current_._M_current = puVar6;
      uVar8 = (ulong)(puVar4 != puVar6);
      if (puVar4 == puVar6) {
        (this->source_).position_ = sVar7 + uVar8;
      }
      else {
        puVar6 = puVar3 + 2;
        uVar9 = 0;
        do {
          (this->source_).current_._M_current = puVar6;
          (&local_2d)[uVar9] = puVar6[-1];
          puVar6 = puVar6 + 1;
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
        (this->source_).position_ = sVar7 + uVar8;
        if (puVar3 + uVar8 + 1 != puVar4) {
          __e = count_required_after_type;
          if (puVar3[uVar8 + 1] == '#') {
            (this->source_).position_ = sVar7 + uVar8 + 1;
            (this->source_).current_._M_current = puVar3 + uVar8 + 2;
            local_28 = get_length(this,ec);
            if (ec->_M_value != 0) {
              return;
            }
            if ((this->options_).max_items_ < local_28) {
              std::error_code::operator=(ec,max_items_exceeded);
              bVar5 = false;
            }
            else {
              local_2c = strongly_typed_map_key;
              std::
              vector<jsoncons::ubjson::parse_state,std::allocator<jsoncons::ubjson::parse_state>>::
              emplace_back<jsoncons::ubjson::parse_mode,unsigned_long&,unsigned_char&>
                        ((vector<jsoncons::ubjson::parse_state,std::allocator<jsoncons::ubjson::parse_state>>
                          *)&this->state_stack_,&local_2c,&local_28,&local_2d);
              (*visitor->_vptr_basic_json_visitor[4])(visitor,local_28,0,this,ec);
              bVar5 = this->cursor_mode_ ^ 1;
            }
            this->more_ = (bool)bVar5;
            return;
          }
          goto LAB_007a24fc;
        }
      }
      __e = unexpected_eof;
    }
  }
  else {
    __e = max_nesting_depth_exceeded;
  }
LAB_007a24fc:
  std::error_code::operator=(ec,__e);
  this->more_ = false;
  return;
}

Assistant:

void begin_object(json_visitor& visitor, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
        {
            ec = ubjson_errc::max_nesting_depth_exceeded;
            more_ = false;
            return;
        } 

        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = ubjson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        if (c.value == jsoncons::ubjson::ubjson_type::type_marker)
        {
            source_.ignore(1);
            uint8_t b;
            if (source_.read(&b, 1) == 0)
            {
                ec = ubjson_errc::unexpected_eof;
                more_ = false;
                return;
            }
            c = source_.peek();
            if (JSONCONS_UNLIKELY(c.eof))
            {
                ec = ubjson_errc::unexpected_eof;
                more_ = false;
                return;
            }
            if (c.value == jsoncons::ubjson::ubjson_type::count_marker)
            {
                source_.ignore(1);
                std::size_t length = get_length(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                if (length > options_.max_items())
                {
                    ec = ubjson_errc::max_items_exceeded;
                    more_ = false;
                    return;
                }
                state_stack_.emplace_back(parse_mode::strongly_typed_map_key,length,b);
                visitor.begin_object(length, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
            }
            else
            {
                ec = ubjson_errc::count_required_after_type;
                more_ = false;
                return;
            }
        }
        else
        {
            c = source_.peek();
            if (JSONCONS_UNLIKELY(c.eof))
            {
                ec = ubjson_errc::unexpected_eof;
                more_ = false;
                return;
            }
            if (c.value == jsoncons::ubjson::ubjson_type::count_marker)
            {
                source_.ignore(1);
                std::size_t length = get_length(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                if (length > options_.max_items())
                {
                    ec = ubjson_errc::max_items_exceeded;
                    more_ = false;
                    return;
                }
                state_stack_.emplace_back(parse_mode::map_key,length);
                visitor.begin_object(length, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
            }
            else
            {
                state_stack_.emplace_back(parse_mode::indefinite_map_key,0);
                visitor.begin_object(semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
            }
        }
    }